

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O2

void verify_large_zip(archive *a,fileblocks *fileblocks)

{
  longlong v1;
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  int64_t v2;
  int64_t *piVar4;
  ulong uVar5;
  archive_entry *ae;
  char namebuff [64];
  
  wVar1 = archive_read_set_options(a,"zip:ignorecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ę',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_set_options(a, \"zip:ignorecrc32\")",a);
  iVar2 = archive_read_set_open_callback(a,memory_read_open);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ě',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_open_callback(a, memory_read_open)",a);
  iVar2 = archive_read_set_read_callback(a,memory_read);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_read_callback(a, memory_read)",a);
  iVar2 = archive_read_set_skip_callback(a,memory_read_skip);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ğ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_skip_callback(a, memory_read_skip)",a);
  iVar2 = archive_read_set_seek_callback(a,memory_read_seek);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ġ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_seek_callback(a, memory_read_seek)",a);
  iVar2 = archive_read_set_callback_data(a,fileblocks);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ģ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_callback_data(a, fileblocks)",a);
  iVar2 = archive_read_open1(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ģ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open1(a)",a);
  piVar4 = test_sizes;
  for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
    iVar2 = archive_read_next_header(a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'Ī',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    sprintf(namebuff,"file_%d",uVar5 & 0xffffffff);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
               ,L'Ĭ',namebuff,"namebuff",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v1 = *piVar4;
    v2 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'ĭ',v1,"test_sizes[i]",v2,"archive_entry_size(ae)",(void *)0x0);
    piVar4 = piVar4 + 1;
  }
  iVar2 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'į',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
             ,L'İ',"lastfile","\"lastfile\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  iVar2 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ĳ',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  iVar2 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ĵ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  return;
}

Assistant:

static void
verify_large_zip(struct archive *a, struct fileblocks *fileblocks)
{
	char namebuff[64];
	struct archive_entry *ae;
	int i;

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "zip:ignorecrc32"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_open_callback(a, memory_read_open));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_read_callback(a, memory_read));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_skip_callback(a, memory_read_skip));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_seek_callback(a, memory_read_seek));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_callback_data(a, fileblocks));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open1(a));

	/*
	 * Read entries back.
	 */
	for (i = 0; test_sizes[i] > 0; i++) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		sprintf(namebuff, "file_%d", i);
		assertEqualString(namebuff, archive_entry_pathname(ae));
		assertEqualInt(test_sizes[i], archive_entry_size(ae));
	}
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("lastfile", archive_entry_pathname(ae));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
}